

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Jump(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  int iVar1;
  DObject *this;
  AActor *this_00;
  int iVar2;
  int iVar3;
  MetaClass *cls;
  FState *val;
  bool bVar4;
  int local_84;
  bool local_7e;
  bool local_7b;
  FState *state_1;
  FState *state;
  FState *jumpto;
  int jumpnum;
  int count;
  int maxchance;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_7b = true;
  if (this != (DObject *)0x0) {
    local_7b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar4 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
    bVar4 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar4) {
    this_00 = (AActor *)param[1].field_0.field_1.a;
    local_7e = true;
    if (this_00 != (AActor *)0x0) {
      local_7e = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_7e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x492,
                    "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x492,
                    "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[2].field_0.field_3.Type == '\x03') {
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x493,
                      "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      if (param[3].field_0.field_3.Type == '\0') {
        iVar1 = param[3].field_0.i;
        iVar2 = numparam + -4;
        if ((iVar2 < 1) ||
           ((iVar1 < 0x100 && (iVar3 = FRandom::operator()(&pr_cajump), iVar1 <= iVar3)))) {
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49d,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetPointer(ret,(void *)0x0,0);
            param_local._4_4_ = 1;
          }
        }
        else {
          if (iVar2 == 1) {
            local_84 = 0;
          }
          else {
            local_84 = FRandom::operator()(&pr_cajump);
            local_84 = local_84 % iVar2;
          }
          if (numparam <= local_84 + 4) {
            __assert_fail("(paramnum + jumpnum) < numparam",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x49a,
                          "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[local_84 + 4].field_0.field_3.Type != '\0') {
            __assert_fail("param[paramnum + jumpnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x49a,
                          "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar1 = param[local_84 + 4].field_0.i;
          cls = AActor::GetClass(this_00);
          val = FStateLabelStorage::GetState(&StateLabels,iVar1,cls,false);
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x49b,
                            "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetPointer(ret,val,0);
            param_local._4_4_ = 1;
          }
        }
        return param_local._4_4_;
      }
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x493,
                    "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Jump)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(maxchance);

	paramnum++;		// Increment paramnum to point at the first jump target
	int count = numparam - paramnum;
	if (count > 0 && (maxchance >= 256 || pr_cajump() < maxchance))
	{
		int jumpnum = (count == 1 ? 0 : (pr_cajump() % count));
		PARAM_STATE_ACTION_AT(paramnum + jumpnum, jumpto);
		ACTION_RETURN_STATE(jumpto);
	}
	ACTION_RETURN_STATE(NULL);
}